

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::ScanCommittedRange
          (ColumnData *this,idx_t row_group_start,idx_t offset_in_row_group,idx_t s_count,
          Vector *result)

{
  bool bVar1;
  idx_t count;
  pointer this_00;
  ColumnData *this_01;
  ColumnScanState child_state;
  
  child_state.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  child_state.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  child_state.current = (ColumnSegment *)0x0;
  child_state.segment_tree = (ColumnSegmentTree *)0x0;
  child_state.row_index = 0;
  child_state.internal_index = 0;
  child_state.initialized = false;
  child_state.segment_checked = false;
  child_state.scan_state.
  super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>._M_t.
  super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
  .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
       (__uniq_ptr_data<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true,_true>
        )0x0;
  child_state.child_states.
  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
  super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  child_state.child_states.
  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
  super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  child_state.child_states.
  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
  super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  child_state.previous_states.
  super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_state.previous_states.
  super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  child_state.previous_states.
  super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  child_state.last_offset._0_4_ = 0;
  child_state.last_offset._4_4_ = 0;
  child_state.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0;
  child_state.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._4_8_ = 0;
  child_state.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  child_state.scan_options.ptr = (TableScanOptions *)0x0;
  (*this->_vptr_ColumnData[8])(this,&child_state,offset_in_row_group + row_group_start);
  this_01 = this;
  bVar1 = HasUpdates(this);
  count = ScanVector(this_01,&child_state,result,s_count,SCAN_FLAT_VECTOR,0);
  if (bVar1) {
    Vector::Flatten(result,count);
    this_00 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
              operator->(&this->updates);
    UpdateSegment::FetchCommittedRange(this_00,offset_in_row_group,s_count,result);
  }
  ColumnScanState::~ColumnScanState(&child_state);
  return;
}

Assistant:

void ColumnData::ScanCommittedRange(idx_t row_group_start, idx_t offset_in_row_group, idx_t s_count, Vector &result) {
	ColumnScanState child_state;
	InitializeScanWithOffset(child_state, row_group_start + offset_in_row_group);
	bool has_updates = HasUpdates();
	auto scan_count = ScanVector(child_state, result, s_count, ScanVectorType::SCAN_FLAT_VECTOR);
	if (has_updates) {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result.Flatten(scan_count);
		updates->FetchCommittedRange(offset_in_row_group, s_count, result);
	}
}